

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

char * hash_get(void *data,char *key)

{
  int iVar1;
  
  if (key != (char *)0x0) {
    for (; (undefined8 *)data != (undefined8 *)0x0; data = *(void **)((long)data + 0x10)) {
      if ((*data != (char *)0x0) && (iVar1 = strcmp(*data,key), iVar1 == 0)) {
        return *(char **)((long)data + 8);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *hash_get(void *data, char *key) {
#ifdef DEBUG
	printf("hash_get([void *], %s)...\n", key);
#endif

	linkedlist_t *map = (linkedlist_t *) data;
	if ( key == NULL ) {
#ifdef DEBUG
		printf("hash_get([void *], %s)... DONE\n", key);
#endif
		return NULL;
	}
	while ( map != NULL ) {
		if ( map->key != NULL && !strcmp(map->key, key) ) {
			return map->value;
		}
		map = map->next;
	}
#ifdef DEBUG
	printf("hash_get([void *], %s)... DONE\n", key);
#endif
	return NULL;
}